

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

void __thiscall Minisat::Solver::reserveVars(Solver *this,Var v)

{
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted> *this_00;
  Var in_ESI;
  long in_RDI;
  int min_cap;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  Var local_c;
  
  local_c = in_ESI;
  local_10 = (int)mkLit(in_ESI,false);
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::init
            ((OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted> *)
             (in_RDI + 0x2b0),(EVP_PKEY_CTX *)&local_10);
  local_14 = (int)mkLit(local_c,true);
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::init
            ((OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted> *)
             (in_RDI + 0x2b0),(EVP_PKEY_CTX *)&local_14);
  local_18 = (int)mkLit(local_c,false);
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::init
            ((OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted> *)
             (in_RDI + 0x2e8),(EVP_PKEY_CTX *)&local_18);
  this_00 = (OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted> *)
            (in_RDI + 0x2e8);
  local_1c = (int)mkLit(local_c,true);
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::init
            (this_00,(EVP_PKEY_CTX *)&local_1c);
  min_cap = (int)((ulong)(in_RDI + 0x2e8) >> 0x20);
  vec<Minisat::lbool>::capacity((vec<Minisat::lbool> *)this_00,min_cap);
  vec<Minisat::Solver::VarData>::capacity((vec<Minisat::Solver::VarData> *)this_00,min_cap);
  vec<unsigned_int>::capacity((vec<unsigned_int> *)this_00,min_cap);
  vec<double>::capacity((vec<double> *)this_00,min_cap);
  vec<double>::capacity((vec<double> *)this_00,min_cap);
  vec<double>::capacity((vec<double> *)this_00,min_cap);
  vec<unsigned_int>::capacity((vec<unsigned_int> *)this_00,min_cap);
  vec<unsigned_int>::capacity((vec<unsigned_int> *)this_00,min_cap);
  vec<unsigned_int>::capacity((vec<unsigned_int> *)this_00,min_cap);
  vec<unsigned_int>::capacity((vec<unsigned_int> *)this_00,min_cap);
  vec<char>::capacity((vec<char> *)this_00,min_cap);
  vec<unsigned_long>::capacity((vec<unsigned_long> *)this_00,min_cap);
  vec<char>::capacity((vec<char> *)this_00,min_cap);
  vec<char>::capacity((vec<char> *)this_00,min_cap);
  vec<Minisat::Lit>::capacity((vec<Minisat::Lit> *)this_00,min_cap);
  vec<Minisat::Lit>::capacity((vec<Minisat::Lit> *)this_00,min_cap);
  vec<double>::capacity((vec<double> *)this_00,min_cap);
  vec<double>::capacity((vec<double> *)this_00,min_cap);
  vec<int>::capacity((vec<int> *)this_00,min_cap);
  return;
}

Assistant:

void Solver::reserveVars(Var v)
{
    watches_bin.init(mkLit(v, false));
    watches_bin.init(mkLit(v, true));
    watches.init(mkLit(v, false));
    watches.init(mkLit(v, true));
    assigns.capacity(v + 1);
    vardata.capacity(v + 1);
    oldreasons.capacity(v + 1);
    activity_CHB.capacity(v + 1);
    activity_VSIDS.capacity(v + 1);
    activity_distance.capacity(v + 1);

    picked.capacity(v + 1);
    conflicted.capacity(v + 1);
    almost_conflicted.capacity(v + 1);
#ifdef ANTI_EXPLORATION
    canceled.capacity(v + 1);
#endif

    seen.capacity(v + 1);
    seen2.capacity(2 * v + 1);
    polarity.capacity(v + 1);
    decision.capacity(v + 1);
    trail.capacity(v + 1);
    old_trail.capacity(v + 1);

    var_iLevel.capacity(v + 1);
    var_iLevel_tmp.capacity(v + 1);
    pathCs.capacity(v + 1);
}